

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FmaCaseInstance::compare
          (FmaCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  pointer pSVar6;
  bool bVar7;
  bool bVar8;
  double dVar9;
  bool bVar10;
  byte bVar11;
  uint uVar12;
  deRoundingMode dVar13;
  ostream *os;
  FloatFormat *this_00;
  ulong uVar14;
  ostringstream *this_01;
  bool bVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  Interval ib;
  Interval res;
  Interval ia;
  Interval ic;
  Interval ref;
  double local_178;
  double local_168;
  double local_158;
  double local_148;
  Interval local_138;
  Interval local_120;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  Interval local_c0;
  FloatFormat local_a8 [3];
  
  pSVar6 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar5 = *(int *)((long)&(pSVar6->varType).m_data + 4);
  uVar12 = glu::getDataTypeScalarSize((pSVar6->varType).m_data.basic.type);
  bVar15 = (int)uVar12 < 1;
  if (0 < (int)uVar12) {
    this_00 = local_a8 + iVar5;
    uVar14 = 0;
    do {
      fVar1 = *(float *)((long)*inputs + uVar14 * 4);
      fVar2 = *(float *)((long)inputs[1] + uVar14 * 4);
      fVar3 = *(float *)((long)inputs[2] + uVar14 * 4);
      fVar4 = *(float *)((long)*outputs + uVar14 * 4);
      tcu::FloatFormat::FloatFormat(local_a8,0,0,7,false,YES,MAYBE,MAYBE);
      tcu::FloatFormat::FloatFormat(local_a8 + 1,-0xd,0xd,9,false,MAYBE,MAYBE,MAYBE);
      tcu::FloatFormat::FloatFormat(local_a8 + 2,-0x7e,0x7f,0x17,true,MAYBE,YES,MAYBE);
      dVar17 = (double)fVar1;
      ib.m_hasNaN = NAN(fVar1);
      ib.m_lo = INFINITY;
      if (!ib.m_hasNaN) {
        ib.m_lo = dVar17;
      }
      ib.m_hi = -INFINITY;
      if (!ib.m_hasNaN) {
        ib.m_hi = dVar17;
      }
      tcu::FloatFormat::convert(&ia,this_00,&ib);
      dVar17 = (double)fVar2;
      ic.m_hasNaN = NAN(fVar2);
      ic.m_lo = INFINITY;
      if (!ic.m_hasNaN) {
        ic.m_lo = dVar17;
      }
      ic.m_hi = -INFINITY;
      if (!ic.m_hasNaN) {
        ic.m_hi = dVar17;
      }
      tcu::FloatFormat::convert(&ib,this_00,&ic);
      dVar17 = (double)fVar3;
      res.m_hasNaN = NAN(fVar3);
      res.m_lo = INFINITY;
      if (!res.m_hasNaN) {
        res.m_lo = dVar17;
      }
      res.m_hi = -INFINITY;
      if (!res.m_hasNaN) {
        res.m_hi = dVar17;
      }
      tcu::FloatFormat::convert(&ic,this_00,&res);
      res.m_hasNaN = false;
      res.m_lo = INFINITY;
      res.m_hi = -INFINITY;
      dVar13 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar22 = ia.m_lo;
      dVar17 = ib.m_lo;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar22 = dVar22 * dVar17;
      bVar10 = NAN(dVar22);
      local_d8 = -INFINITY;
      if (!bVar10) {
        local_d8 = dVar22;
      }
      uStack_d0 = 0;
      local_e8 = INFINITY;
      if (!bVar10) {
        local_e8 = dVar22;
      }
      uStack_e0 = 0;
      dVar17 = ia.m_lo * ib.m_lo;
      local_158 = INFINITY;
      local_148 = -INFINITY;
      if (!NAN(dVar17)) {
        local_158 = dVar17;
        local_148 = dVar17;
      }
      deSetRoundingMode(dVar13);
      dVar13 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar18 = ia.m_lo;
      dVar22 = ib.m_hi;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar18 = dVar18 * dVar22;
      local_f8 = -INFINITY;
      if (!NAN(dVar18)) {
        local_f8 = dVar18;
      }
      uStack_f0 = 0;
      dVar22 = ia.m_lo * ib.m_hi;
      local_168 = INFINITY;
      if (!NAN(dVar22)) {
        local_168 = dVar22;
      }
      deSetRoundingMode(dVar13);
      dVar13 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar19 = ia.m_hi;
      dVar20 = ib.m_lo;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar19 = dVar19 * dVar20;
      local_108 = -INFINITY;
      if (!NAN(dVar19)) {
        local_108 = dVar19;
      }
      uStack_100 = 0;
      dVar20 = ia.m_hi * ib.m_lo;
      local_178 = INFINITY;
      if (!NAN(dVar20)) {
        local_178 = dVar20;
      }
      deSetRoundingMode(dVar13);
      dVar13 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar23 = ia.m_hi;
      dVar21 = ib.m_hi;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar31 = ia.m_hi;
      dVar29 = ib.m_hi;
      deSetRoundingMode(dVar13);
      dVar23 = dVar23 * dVar21;
      bVar7 = NAN(dVar23);
      dVar21 = -INFINITY;
      if (!bVar7) {
        dVar21 = dVar23;
      }
      dVar26 = INFINITY;
      if (!bVar7) {
        dVar26 = dVar23;
      }
      dVar31 = dVar31 * dVar29;
      bVar8 = NAN(dVar31);
      dVar29 = -INFINITY;
      if (!bVar8) {
        dVar29 = dVar31;
      }
      dVar24 = (double)(~-(ulong)(local_e8 <= local_158) & (ulong)local_158 |
                       (ulong)local_e8 & -(ulong)(local_e8 <= local_158));
      dVar25 = (double)(~-(ulong)(local_148 <= local_d8) & (ulong)local_148 |
                       (ulong)local_d8 & -(ulong)(local_148 <= local_d8));
      dVar23 = (double)(-(ulong)NAN(dVar18) & 0x7ff0000000000000 |
                       ~-(ulong)NAN(dVar18) & (ulong)dVar18);
      dVar30 = (double)(~-(ulong)NAN(dVar22) & (ulong)dVar22 |
                       -(ulong)NAN(dVar22) & 0xfff0000000000000);
      uVar16 = -(ulong)(dVar23 <= local_168);
      dVar28 = (double)(~uVar16 & (ulong)local_168 | uVar16 & (ulong)dVar23);
      uVar16 = -(ulong)(dVar30 <= local_f8);
      dVar9 = (double)(~uVar16 & (ulong)dVar30 | (ulong)local_f8 & uVar16);
      dVar30 = (double)(-(ulong)NAN(dVar19) & 0x7ff0000000000000 |
                       ~-(ulong)NAN(dVar19) & (ulong)dVar19);
      dVar23 = (double)(~-(ulong)NAN(dVar20) & (ulong)dVar20 |
                       -(ulong)NAN(dVar20) & 0xfff0000000000000);
      uVar16 = -(ulong)(dVar30 <= local_178);
      dVar30 = (double)(~uVar16 & (ulong)local_178 | uVar16 & (ulong)dVar30);
      uVar16 = -(ulong)(dVar23 <= local_108);
      dVar23 = (double)(~uVar16 & (ulong)dVar23 | (ulong)local_108 & uVar16);
      dVar29 = (double)(~-(ulong)(dVar29 <= dVar21) & (ulong)dVar29 |
                       (ulong)dVar21 & -(ulong)(dVar29 <= dVar21));
      dVar21 = INFINITY;
      if (!bVar8) {
        dVar21 = dVar31;
      }
      dVar27 = (double)(~-(ulong)(dVar26 <= dVar21) & (ulong)dVar21 |
                       (ulong)dVar26 & -(ulong)(dVar26 <= dVar21));
      uVar16 = -(ulong)(dVar24 <= dVar28);
      dVar21 = (double)(~uVar16 & (ulong)dVar28 | uVar16 & (ulong)dVar24);
      uVar16 = -(ulong)(dVar9 <= dVar25);
      dVar31 = (double)(~uVar16 & (ulong)dVar9 | uVar16 & (ulong)dVar25);
      uVar16 = -(ulong)(dVar21 <= dVar30);
      dVar26 = (double)(~uVar16 & (ulong)dVar30 | uVar16 & (ulong)dVar21);
      uVar16 = -(ulong)(dVar23 <= dVar31);
      dVar21 = (double)(~uVar16 & (ulong)dVar23 | uVar16 & (ulong)dVar31);
      local_138.m_hasNaN =
           (bVar7 || bVar8) ||
           (((NAN(dVar22) || NAN(dVar19)) || NAN(dVar20)) ||
           ((bVar10 || NAN(dVar17)) || NAN(dVar18)));
      uVar16 = -(ulong)(dVar26 <= dVar27);
      local_138.m_lo = (double)(uVar16 & (ulong)dVar26 | ~uVar16 & (ulong)dVar27);
      uVar16 = -(ulong)(dVar29 <= dVar21);
      local_138.m_hi = (double)(uVar16 & (ulong)dVar21 | ~uVar16 & (ulong)dVar29);
      bVar10 = false;
      if ((ia.m_lo != -INFINITY) && (ia.m_hi != INFINITY)) {
        bVar10 = ib.m_hi != INFINITY && ib.m_lo != -INFINITY;
      }
      tcu::FloatFormat::roundOut(&local_c0,this_00,&local_138,bVar10);
      tcu::FloatFormat::convert(&local_120,this_00,&local_c0);
      dVar18 = local_120.m_hi;
      dVar22 = local_120.m_lo;
      dVar13 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar17 = ic.m_lo;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar17 = dVar17 + dVar22;
      bVar10 = NAN(dVar17);
      dVar20 = -INFINITY;
      if (!bVar10) {
        dVar20 = dVar17;
      }
      dVar19 = INFINITY;
      if (!bVar10) {
        dVar19 = dVar17;
      }
      dVar29 = ic.m_hi + dVar18;
      dVar17 = INFINITY;
      dVar21 = -INFINITY;
      if (!NAN(dVar29)) {
        dVar17 = dVar29;
        dVar21 = dVar29;
      }
      res.m_hasNaN = bVar10 || NAN(dVar29);
      res.m_lo = (double)(~-(ulong)(dVar19 <= dVar17) & (ulong)dVar17 |
                         (ulong)dVar19 & -(ulong)(dVar19 <= dVar17));
      res.m_hi = (double)(~-(ulong)(dVar21 <= dVar20) & (ulong)dVar21 |
                         (ulong)dVar20 & -(ulong)(dVar21 <= dVar20));
      deSetRoundingMode(dVar13);
      bVar10 = false;
      if ((dVar22 != -INFINITY) && (dVar18 != INFINITY)) {
        bVar10 = ic.m_hi != INFINITY && ic.m_lo != -INFINITY;
      }
      tcu::FloatFormat::roundOut(&local_120,this_00,&res,bVar10);
      tcu::FloatFormat::convert(&ref,this_00,&local_120);
      dVar22 = (double)fVar4;
      dVar17 = dVar22;
      if (NAN(fVar4)) {
        dVar17 = INFINITY;
        dVar22 = -INFINITY;
      }
      bVar11 = ref.m_lo <= dVar17 && dVar22 <= ref.m_hi;
      if ((NAN(fVar4)) && (ref.m_lo <= dVar17 && dVar22 <= ref.m_hi)) {
        bVar11 = ref.m_hasNaN;
      }
      if ((bVar11 & 1) == 0) {
        this_01 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Expected [",10);
        os = (ostream *)std::ostream::operator<<(this_01,(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(os,"] = ",4);
        tcu::operator<<(os,&ref);
        return bVar15;
      }
      uVar14 = uVar14 + 1;
      bVar15 = uVar12 <= uVar14;
    } while (uVar14 != uVar12);
  }
  return bVar15;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float			a			= ((const float*)inputs[0])[compNdx];
			const float			b			= ((const float*)inputs[1])[compNdx];
			const float			c			= ((const float*)inputs[2])[compNdx];
			const float			res			= ((const float*)outputs[0])[compNdx];
			const tcu::Interval	ref			= fma(precision, a, b, c);

			if (!ref.contains(res))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << ref;
				return false;
			}
		}

		return true;
	}